

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

uint8 * google::protobuf::internal::WireFormatLite::InternalWriteMessageToArray
                  (int field_number,MessageLite *value,bool deterministic,uint8 *target)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  byte *pbVar5;
  
  uVar4 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar2 = (uint)uVar4;
      *target = (byte)uVar4 | 0x80;
      uVar4 = uVar4 >> 7;
      target = target + 1;
    } while (0x3fff < uVar2);
  }
  *target = (byte)uVar4;
  pbVar5 = target + 1;
  uVar2 = (*value->_vptr_MessageLite[0xf])(value);
  if (uVar2 < 0x80) {
    uVar4 = (ulong)uVar2;
  }
  else {
    uVar4 = (ulong)uVar2;
    do {
      *pbVar5 = (byte)uVar2 | 0x80;
      uVar4 = uVar4 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = (uint)uVar4;
    } while (bVar1);
  }
  *pbVar5 = (byte)uVar4;
  iVar3 = (*value->_vptr_MessageLite[0x10])(value,deterministic,pbVar5 + 1);
  return (uint8 *)CONCAT44(extraout_var,iVar3);
}

Assistant:

inline uint8* WireFormatLite::InternalWriteMessageToArray(
    int field_number, const MessageLite& value, bool deterministic,
    uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(
    value.GetCachedSize(), target);
  return value.InternalSerializeWithCachedSizesToArray(deterministic, target);
}